

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupCones(Gia_Man_t *p,int *pPos,int nPos,int fTrimPis)

{
  Gia_Obj_t *pGVar1;
  char *pcVar2;
  void *pvVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  Vec_Ptr_t *vLeaves;
  void **ppvVar6;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vLeaves->pArray = ppvVar6;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vNodes->pArray = ppvVar6;
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  vRoots->pArray = ppvVar6;
  uVar18 = (ulong)(uint)nPos;
  if (0 < nPos) {
    iVar12 = 0;
    uVar21 = 100;
    uVar15 = 0;
    do {
      uVar13 = pPos[uVar15];
      iVar16 = p->vCos->nSize;
      if (iVar16 - p->nRegs <= (int)uVar13) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar13 < 0) || (iVar16 <= (int)uVar13)) goto LAB_00686591;
      iVar16 = p->vCos->pArray[uVar13];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_00686553;
      pGVar1 = p->pObjs;
      iVar20 = (int)uVar21;
      if (iVar12 == iVar20) {
        if (iVar20 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vRoots->pArray,0x80);
          }
          vRoots->pArray = ppvVar6;
          vRoots->nCap = 0x10;
          uVar21 = 0x10;
        }
        else {
          uVar21 = (ulong)(uint)(iVar20 * 2);
          if (vRoots->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(uVar21 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(vRoots->pArray,uVar21 * 8);
          }
          vRoots->pArray = ppvVar6;
          vRoots->nCap = iVar20 * 2;
        }
      }
      else {
        ppvVar6 = vRoots->pArray;
      }
      iVar20 = vRoots->nSize;
      iVar12 = iVar20 + 1;
      vRoots->nSize = iVar12;
      ppvVar6[iVar20] = pGVar1 + iVar16;
      uVar15 = uVar15 + 1;
    } while (uVar18 != uVar15);
  }
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
LAB_00686534:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x227,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  *p->pTravIds = p->nTravIds;
  iVar12 = vRoots->nSize;
  if (0 < iVar12) {
    lVar19 = 0;
    do {
      Gia_ManDupCones_rec(p,(Gia_Obj_t *)vRoots->pArray[lVar19],vLeaves,vNodes,vRoots);
      lVar19 = lVar19 + 1;
      iVar12 = vRoots->nSize;
    } while (lVar19 < iVar12);
  }
  iVar16 = vLeaves->nSize;
  if (1 < (long)iVar16) {
    qsort(vLeaves->pArray,(long)iVar16,8,Gia_ObjCompareByCioId);
    iVar16 = vLeaves->nSize;
    iVar12 = vRoots->nSize;
  }
  p_00 = Gia_ManStart(iVar12 + iVar16 + vNodes->nSize + 1);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  if (fTrimPis == 0) {
    pVVar10 = p->vCis;
    uVar15 = (ulong)(uint)pVVar10->nSize;
    if (p->nRegs < pVVar10->nSize) {
      lVar19 = 0;
      do {
        if ((int)uVar15 <= lVar19) goto LAB_00686591;
        iVar12 = pVVar10->pArray[lVar19];
        if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_00686553;
        pGVar1 = p->pObjs;
        if (pGVar1 == (Gia_Obj_t *)0x0) break;
        pGVar11 = Gia_ManAppendObj(p_00);
        uVar15 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar15 | 0x9fffffff;
        *(ulong *)pGVar11 =
             uVar15 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar9 = p_00->pObjs;
        if ((pGVar11 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar11)) goto LAB_00686534;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar9) >> 2) * -0x55555555);
        pGVar9 = p_00->pObjs;
        if ((pGVar11 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar11)) goto LAB_00686534;
        pGVar1[iVar12].Value = (int)((ulong)((long)pGVar11 - (long)pGVar9) >> 2) * 0x55555556;
        lVar19 = lVar19 + 1;
        pVVar10 = p->vCis;
        uVar15 = (ulong)pVVar10->nSize;
      } while (lVar19 < (long)(uVar15 - (long)p->nRegs));
    }
  }
  else if (0 < vLeaves->nSize) {
    lVar19 = 0;
    do {
      pvVar3 = vLeaves->pArray[lVar19];
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p_00->pObjs;
      if ((pGVar9 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar9)) goto LAB_00686534;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar1) >> 2) * -0x55555555);
      pGVar1 = p_00->pObjs;
      if ((pGVar9 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar9)) goto LAB_00686534;
      *(int *)((long)pvVar3 + 8) = (int)((ulong)((long)pGVar9 - (long)pGVar1) >> 2) * 0x55555556;
      lVar19 = lVar19 + 1;
    } while (lVar19 < vLeaves->nSize);
  }
  iVar12 = vRoots->nSize;
  if (nPos < iVar12) {
    do {
      if (nPos < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar4 = (undefined8 *)vRoots->pArray[uVar18];
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p_00->pObjs;
      if ((pGVar9 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar9)) goto LAB_00686534;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar1) >> 2) * -0x55555555);
      pGVar1 = p_00->pObjs;
      if ((pGVar9 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar9)) goto LAB_00686534;
      uVar13 = (uint)*puVar4;
      if ((-1 < (int)uVar13) || ((uVar13 & 0x1fffffff) == 0x1fffffff)) {
LAB_006865b0:
        __assert_fail("Gia_ObjIsRi(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1d0,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar13 = (uint)((ulong)*puVar4 >> 0x20) & 0x1fffffff;
      iVar12 = p->vCos->nSize;
      if ((int)uVar13 < iVar12 - p->nRegs) goto LAB_006865b0;
      iVar16 = p->vCis->nSize;
      uVar13 = (iVar16 - iVar12) + uVar13;
      if (((int)uVar13 < 0) || (iVar16 <= (int)uVar13)) {
LAB_00686591:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar12 = p->vCis->pArray[uVar13];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) {
LAB_00686553:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      p->pObjs[iVar12].Value = (int)((ulong)((long)pGVar9 - (long)pGVar1) >> 2) * 0x55555556;
      uVar18 = uVar18 + 1;
      iVar12 = vRoots->nSize;
    } while ((int)uVar18 < iVar12);
  }
  if (0 < vNodes->nSize) {
    lVar19 = 0;
    do {
      puVar5 = (ulong *)vNodes->pArray[lVar19];
      uVar18 = *puVar5;
      uVar13 = *(uint *)((long)puVar5 + (ulong)((uint)uVar18 & 0x1fffffff) * -0xc + 8);
      if ((int)uVar13 < 0) goto LAB_00686572;
      uVar14 = (uint)(uVar18 >> 0x20);
      uVar17 = *(uint *)((long)puVar5 + (ulong)(uVar14 & 0x1fffffff) * -0xc + 8);
      if ((int)uVar17 < 0) goto LAB_00686572;
      iVar12 = Gia_ManAppendAnd(p_00,(uint)(uVar18 >> 0x1d) & 1 ^ uVar13,uVar17 ^ uVar14 >> 0x1d & 1
                               );
      *(int *)(puVar5 + 1) = iVar12;
      lVar19 = lVar19 + 1;
    } while (lVar19 < vNodes->nSize);
    iVar12 = vRoots->nSize;
  }
  if (0 < iVar12) {
    lVar19 = 0;
    do {
      uVar17 = (uint)*vRoots->pArray[lVar19];
      uVar13 = *(uint *)((long)vRoots->pArray[lVar19] + (ulong)(uVar17 & 0x1fffffff) * -0xc + 8);
      if ((int)uVar13 < 0) {
LAB_00686572:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar17 >> 0x1d & 1 ^ uVar13);
      lVar19 = lVar19 + 1;
      iVar12 = vRoots->nSize;
    } while (lVar19 < iVar12);
  }
  Gia_ManSetRegNum(p_00,iVar12 - nPos);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  if (vRoots->pArray != (void **)0x0) {
    free(vRoots->pArray);
  }
  free(vRoots);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupCones( Gia_Man_t * p, int * pPos, int nPos, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1);
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // finalize
    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}